

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int compare_int64(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*b <= *a) {
    uVar1 = (uint)(*a != *b);
  }
  return uVar1;
}

Assistant:

static int compare_int64(const void *a, const void *b) {
  int64_t a64 = *((int64_t *)a);
  int64_t b64 = *((int64_t *)b);
  if (a64 < b64) {
    return -1;
  } else if (a64 == b64) {
    return 0;
  } else {
    return 1;
  }
}